

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O2

void __thiscall
deci::parser_t::yy_print_<deci::parser_t::by_state>
          (parser_t *this,ostream *yyo,basic_symbol<deci::parser_t::by_state> *yysym)

{
  long lVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  char *pcVar4;
  string local_40;
  
  lVar1 = (long)(yysym->super_by_state).state;
  if ((lVar1 != 0) && (yystos_[lVar1] != -2)) {
    pcVar4 = "nterm";
    if ((char)yystos_[lVar1] < ',') {
      pcVar4 = "token";
    }
    poVar2 = std::operator<<(yyo,pcVar4);
    poVar2 = std::operator<<(poVar2,' ');
    basic_symbol<deci::parser_t::by_state>::name_abi_cxx11_(&local_40,yysym);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2," (");
    pbVar3 = operator<<(poVar2,&yysym->location);
    std::operator<<(pbVar3,": ");
    std::__cxx11::string::~string((string *)&local_40);
    std::operator<<(yyo,')');
    return;
  }
  std::operator<<(yyo,"empty symbol");
  return;
}

Assistant:

void
   parser_t ::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        YY_USE (yykind);
        yyo << ')';
      }
  }